

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O2

string * tinyusdz::to_lower(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,tinyusdz::to_lower(std::__cxx11::string_const&)::_lambda(unsigned_char)_1_>
            (pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline const std::string to_lower(const std::string &str) {
  std::string result = str;
  std::transform(result.begin(), result.end(), result.begin(), [](unsigned char c) {
    if ((c >= 'A') && (c <= 'Z')) {
      c += 32;
    }
    return static_cast<char>(c);
  });
  return result;
}